

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shm.h
# Opt level: O2

void __thiscall
HalosExchange::sendrecv(HalosExchange *this,int i,MPI_Request *send_rq,MPI_Request *recv_rq,int tag)

{
  undefined4 in_register_00000084;
  
  MPI_Irecv(this->rbuf[i],this->n_elements,&ompi_mpi_double,this->partners[i],
            CONCAT44(in_register_00000084,tag),&ompi_mpi_comm_world,recv_rq);
  MPI_Isend(this->sbuf,this->n_elements,&ompi_mpi_double,this->partners[i],tag,&ompi_mpi_comm_world,
            send_rq);
  return;
}

Assistant:

virtual void sendrecv(int i, MPI_Request* send_rq, MPI_Request* recv_rq,
                          int tag)
    {
        MPI_Irecv(rbuf[i], n_elements, MPI_DOUBLE, partners[i], tag,
                  MPI_COMM_WORLD, recv_rq);
        MPI_Isend(sbuf, n_elements, MPI_DOUBLE, partners[i], tag,
                  MPI_COMM_WORLD, send_rq);
    }